

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O0

AmsNetId * AddRoute(AmsNetId ams,char *ip)

{
  long adsErrorCode;
  AdsException *this;
  AmsNetId *pAVar1;
  long error;
  char *ip_local;
  AmsNetId ams_local;
  
  adsErrorCode = bhf::ads::AddLocalRoute
                           ((AmsNetId)((uint6)ams.b & 0xffffffff | (uint6)ams.b._4_2_ << 0x20),ip);
  if (adsErrorCode != 0) {
    this = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(this,adsErrorCode);
    __cxa_throw(this,&AdsException::typeinfo,AdsException::~AdsException);
  }
  pAVar1 = (AmsNetId *)operator_new(6);
  *(int *)pAVar1->b = ams.b._0_4_;
  *(ushort *)(pAVar1->b + 4) = ams.b._4_2_;
  return pAVar1;
}

Assistant:

static AmsNetId* AddRoute(AmsNetId ams, const char* ip)
{
    const auto error = bhf::ads::AddLocalRoute(ams, ip);
    if (error) {
        throw AdsException(error);
    }
    return new AmsNetId {ams};
}